

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetScalarFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a1;
  undefined1 local_a0 [7];
  bool is_bool;
  string local_80;
  undefined1 local_50 [8];
  string getter;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  getter.field_2._8_8_ = code_ptr;
  GenGetter_abi_cxx11_((string *)local_50,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>(&local_80,&(this->namer_).super_Namer,field);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"(self):");
  OffsetPrefix_abi_cxx11_((string *)local_a0,this,field,true);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::operator+=((string *)local_50,"o + self._tab.Pos)");
  local_a1 = IsBool((field->value).type.base_type);
  if ((bool)local_a1) {
    std::operator+(&local_e8,"bool(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_c8,&local_e8,")");
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&default_value.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&default_value.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148,&local_168,"return ");
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_108,&local_128,"\n");
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)(default_value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1a8);
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_1a8,"None");
  }
  else if ((local_a1 & 1) == 0) {
    bVar1 = IsFloat((field->value).type.base_type);
    if (bVar1) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (&local_1c8,&(this->float_const_gen_).super_FloatConstantGenerator,field);
    }
    else {
      std::__cxx11::string::string((string *)&local_1c8,(string *)&(field->value).constant);
    }
    std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    bVar1 = std::operator==(&(field->value).constant,"0");
    pcVar2 = "True";
    if (bVar1) {
      pcVar2 = "False";
    }
    std::__cxx11::string::operator=((string *)local_1a8,pcVar2);
  }
  std::operator+(&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_228,&local_248,"return ");
  std::operator+(&local_208,&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  std::operator+(&local_1e8,&local_208,"\n\n");
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void GetScalarFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) const {
    auto &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self):";
    code += OffsetPrefix(field);
    getter += "o + self._tab.Pos)";
    auto is_bool = IsBool(field.value.type.base_type);
    if (is_bool) { getter = "bool(" + getter + ")"; }
    code += Indent + Indent + Indent + "return " + getter + "\n";
    std::string default_value;
    if (field.IsScalarOptional()) {
      default_value = "None";
    } else if (is_bool) {
      default_value = field.value.constant == "0" ? "False" : "True";
    } else {
      default_value = IsFloat(field.value.type.base_type)
                          ? float_const_gen_.GenFloatConstant(field)
                          : field.value.constant;
    }
    code += Indent + Indent + "return " + default_value + "\n\n";
  }